

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

void __thiscall argsman_tests::util_ParseParameters::test_method(util_ParseParameters *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *this_00;
  _Base_ptr p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  string *psVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  long lVar15;
  long *plVar16;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  check_type cVar17;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_768;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  lazy_ostream local_630;
  undefined1 *local_620;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_618;
  assertion_result local_610;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  unique_lock<std::recursive_mutex> local_488;
  key_type local_478;
  key_type local_458;
  key_type local_438;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uint local_358;
  string local_350 [32];
  undefined4 local_330;
  string local_328 [32];
  undefined4 local_308;
  string local_300 [16];
  long local_2f0 [2];
  undefined4 local_2e0;
  string local_2d8;
  char *local_2b8;
  char *pcStack_2b0;
  undefined8 local_2a8;
  char *pcStack_2a0;
  char *local_298;
  char *pcStack_290;
  char *local_288;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_280.m_network_only_args._M_t);
  local_288 = "-d=e";
  local_298 = "-ccc=multiple";
  pcStack_290 = "f";
  local_2a8 = _DAT_013ae4b0;
  pcStack_2a0 = "-ccc=argument";
  local_2b8 = PTR_anon_var_dwarf_28a6f9_013ae4a0;
  pcStack_2b0 = "-a";
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_488._M_owns = false;
  local_488._M_device = (mutex_type *)&local_280;
  std::unique_lock<std::recursive_mutex>::lock(&local_488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"-a",(allocator<char> *)&local_3b8);
  local_358 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_350,"-b",(allocator<char> *)&local_3b8);
  local_330 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_328,"-ccc",(allocator<char> *)&local_3b8)
  ;
  local_308 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_300,"-d",(allocator<char> *)&local_3b8);
  local_2e0 = 1;
  __l._M_len = 4;
  __l._M_array = (iterator)local_378;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_398,__l,(allocator_type *)&local_3b8);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)&local_280,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_398);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_398);
  lVar15 = -0xa0;
  plVar16 = local_2f0;
  do {
    if (plVar16 != (long *)plVar16[-2]) {
      operator_delete((long *)plVar16[-2],*plVar16 + 1);
    }
    plVar16 = plVar16 + -5;
    lVar15 = lVar15 + 0x28;
  } while (lVar15 != 0);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xde;
  file.m_begin = (iterator)&local_498;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4a8,msg);
  bVar4 = ArgsManager::ParseParameters(&local_280,0,&local_2b8,&local_2d8);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(0, argv_test, error)";
  local_3b8._M_string_length = 0xe5d3d4;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4b0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  local_398._M_dataplus._M_p._0_1_ = bVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_4b8,0xde);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xdf;
  file_00.m_begin = (iterator)&local_4c8;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d8,
             msg_00);
  local_398._M_dataplus._M_p._0_1_ =
       local_280.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
       local_280.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty()";
  local_3b8._M_string_length = 0xe5d42e;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4e0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_4e8,0xdf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xe1;
  file_01.m_begin = (iterator)&local_4f8;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_508,
             msg_01);
  local_398._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&local_280,1,&local_2b8,&local_2d8);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(1, argv_test, error)";
  local_3b8._M_string_length = 0xe5d45c;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_510 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_518,0xe1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe2;
  file_02.m_begin = (iterator)&local_528;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_538,
             msg_02);
  local_398._M_dataplus._M_p._0_1_ =
       local_280.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
       local_280.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty()";
  local_3b8._M_string_length = 0xe5d42e;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_540 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_548,0xe2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe4;
  file_03.m_begin = (iterator)&local_558;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
             msg_03);
  local_398._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&local_280,7,&local_2b8,&local_2d8);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(7, argv_test, error)";
  local_3b8._M_string_length = 0xe5d48a;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_570 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_578,0xe4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xe8;
  file_04.m_begin = (iterator)&local_588;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_598,
             msg_04);
  local_398._M_dataplus._M_p._0_1_ =
       local_280.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       3 && local_280.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty()"
  ;
  local_3b8._M_string_length = 0xe5d4e8;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_368._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_368._8_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar17,
             (size_t)&local_5a8,0xe8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xea;
  file_05.m_begin = (iterator)&local_5b8;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5c8,
             msg_05);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"-a","");
  bVar5 = ArgsManager::IsArgSet(&local_280,(string *)local_378);
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  bVar7 = false;
  if (bVar5) {
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"-b","");
    bVar6 = ArgsManager::IsArgSet(&local_280,&local_398);
    bVar3 = false;
    bVar2 = false;
    bVar4 = false;
    bVar7 = false;
    if (bVar6) {
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"-ccc","");
      bVar4 = ArgsManager::IsArgSet(&local_280,&local_3b8);
      if (bVar4) {
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"f","");
        bVar4 = ArgsManager::IsArgSet(&local_280,&local_3d8);
        if (!bVar4) {
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"-d","");
          bVar7 = ArgsManager::IsArgSet(&local_280,&local_3f8);
          bVar7 = !bVar7;
          bVar3 = true;
          bVar2 = true;
          bVar4 = true;
          goto LAB_0026478b;
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      bVar4 = false;
      bVar3 = true;
      bVar7 = false;
    }
  }
LAB_0026478b:
  local_438._M_dataplus._M_p._0_1_ = bVar7;
  local_438._M_string_length = 0;
  local_438.field_2._M_allocated_capacity = 0;
  local_408._8_8_ = &local_458;
  local_458._M_dataplus._M_p =
       "testArgs.IsArgSet(\"-a\") && testArgs.IsArgSet(\"-b\") && testArgs.IsArgSet(\"-ccc\") && !testArgs.IsArgSet(\"f\") && !testArgs.IsArgSet(\"-d\")"
  ;
  local_458._M_string_length = 0xe5d56f;
  local_418[8] = false;
  local_418._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_408._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5d0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_438,(lazy_ostream *)local_418,1,0,WARN,_cVar17,
             (size_t)&local_5d8,0xea);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_438.field_2._M_allocated_capacity);
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2)) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2)) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2)) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2)) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_5e8;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5f8,
             msg_06);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"a","");
  this_00 = &local_280.m_settings.command_line_options;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_378);
  p_Var1 = &local_280.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header;
  if (cVar9._M_node == p_Var1) {
LAB_00264a34:
    bVar4 = false;
LAB_00264a42:
    bVar2 = false;
  }
  else {
    local_418._0_8_ = &local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"b","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             ::find(&this_00->_M_t,(key_type *)local_418);
    if (cVar10._M_node == p_Var1) goto LAB_00264a34;
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"ccc","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             ::find(&this_00->_M_t,&local_438);
    if (cVar10._M_node == p_Var1) {
      bVar4 = true;
      goto LAB_00264a42;
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"f","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
             ::find(&this_00->_M_t,&local_458);
    if (cVar10._M_node == p_Var1) {
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"d","");
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
               ::find(&this_00->_M_t,&local_478);
      local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(cVar10._M_node == p_Var1);
      bVar4 = true;
      bVar2 = true;
      bVar3 = true;
      goto LAB_00264a49;
    }
    bVar4 = true;
    bVar2 = true;
  }
  bVar3 = false;
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
LAB_00264a49:
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = &local_768;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d570;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d683;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_638 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_640,0xec);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2)) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2)) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2)) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((cVar9._M_node != p_Var1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != &local_408)) {
    operator_delete((void *)local_418._0_8_,(ulong)(local_408._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xee;
  file_07.m_begin = (iterator)&local_650;
  msg_07.m_end = pvVar14;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_660,
             msg_07);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"a","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](this_00,(key_type *)local_378);
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)(pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start == 0x58);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d684;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d6bd;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_668 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_618 = &local_768;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_670,0xee);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xef;
  file_08.m_begin = (iterator)&local_680;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_690,
             msg_08);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"a","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](this_00,(key_type *)local_378);
  psVar12 = ::UniValue::get_str_abi_cxx11_
                      ((pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar12,"");
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar8 == 0);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d6be;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d703;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_698 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_618 = &local_768;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_6a0,0xef);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xf0;
  file_09.m_begin = (iterator)&local_6b0;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_6c0,
             msg_09);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"ccc","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](this_00,(key_type *)local_378);
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)(pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start == 0xb0);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d704;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d73f;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6c8 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_618 = &local_768;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_6d0,0xf0);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xf1;
  file_10.m_begin = (iterator)&local_6e0;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_6f0,
             msg_10);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"ccc","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](this_00,(key_type *)local_378);
  psVar12 = ::UniValue::get_str_abi_cxx11_
                      ((pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar12,"argument");
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar8 == 0);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d740;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d78f;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6f8 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_618 = &local_768;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_700,0xf1);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xf2;
  file_11.m_begin = (iterator)&local_710;
  msg_11.m_end = pvVar14;
  msg_11.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_720,
             msg_11);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"ccc","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](this_00,(key_type *)local_378);
  psVar12 = ::UniValue::get_str_abi_cxx11_
                      ((pmVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_finish + -1);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar12,"multiple");
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar8 == 0);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe5d790;
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe5d7de;
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_728 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_618 = &local_768;
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_730,0xf2);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xf3;
  file_12.m_begin = (iterator)&local_740;
  msg_12.m_end = pvVar14;
  msg_12.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_750,
             msg_12);
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"-ccc","");
  ArgsManager::GetArgs(&local_768,&local_280,(string *)local_378);
  local_610.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)local_768.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_768.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40);
  local_610.m_message.px = (element_type *)0x0;
  local_610.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_778;
  local_778 = "testArgs.GetArgs(\"-ccc\").size() == 2";
  local_770 = "";
  local_630.m_empty = false;
  local_630._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_620 = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_780 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_610,&local_630,1,0,WARN,_cVar17,(size_t)&local_788,0xf3);
  boost::detail::shared_count::~shared_count(&local_610.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  ArgsManager::~ArgsManager(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseParameters)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {"-ignored", "-a", "-b", "-ccc=argument", "-ccc=multiple", "f", "-d=e"};

    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, ccc, d});
    BOOST_CHECK(testArgs.ParseParameters(0, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(1, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));
    // expectation: -ignored is ignored (program name argument),
    // -a, -b and -ccc end up in map, -d ignored because it is after
    // a non-option argument (non-GNU option parsing)
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty());
    BOOST_CHECK(testArgs.IsArgSet("-a") && testArgs.IsArgSet("-b") && testArgs.IsArgSet("-ccc")
                && !testArgs.IsArgSet("f") && !testArgs.IsArgSet("-d"));
    BOOST_CHECK(testArgs.m_settings.command_line_options.count("a") && testArgs.m_settings.command_line_options.count("b") && testArgs.m_settings.command_line_options.count("ccc")
                && !testArgs.m_settings.command_line_options.count("f") && !testArgs.m_settings.command_line_options.count("d"));

    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].size() == 1);
    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].front().get_str() == "");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].size() == 2);
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].front().get_str() == "argument");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].back().get_str() == "multiple");
    BOOST_CHECK(testArgs.GetArgs("-ccc").size() == 2);
}